

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool slang::ast::Lookup::ensureAccessible
               (Symbol *symbol,ASTContext *context,optional<slang::SourceRange> sourceRange)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  string_view arg;
  string_view arg_00;
  bool bVar1;
  SourceRange *pSVar2;
  SourceLocation in_RSI;
  Symbol *in_RDI;
  pair<const_slang::ast::ClassType_*,_bool> pVar3;
  Diagnostic *diag;
  type_conflict *inStatic;
  type *parent;
  Scope *in_stack_ffffffffffffff00;
  Symbol *in_stack_ffffffffffffff08;
  Symbol *pSVar4;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  Symbol *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  byte bVar5;
  SourceLocation in_stack_ffffffffffffff28;
  Scope *in_stack_ffffffffffffff30;
  DiagCode code;
  Diagnostic *this;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  bitmask<slang::ast::ASTFlags> local_90;
  size_t local_88;
  char *local_80;
  size_t local_78;
  char *local_70;
  SourceLocation local_68;
  SourceLocation local_60;
  undefined4 local_54;
  Diagnostic *local_50;
  type_conflict *local_48;
  type *local_40;
  ClassType *local_38;
  undefined1 local_30;
  ClassType *local_28;
  undefined1 local_20;
  SourceLocation local_18;
  Symbol *local_10;
  bool local_1;
  
  this = (Diagnostic *)&stack0x00000008;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((*(long *)((long)in_RSI + 0x28) != 0) && (**(long **)((long)in_RSI + 0x28) != 0)) {
    Scope::asSymbol((Scope *)**(undefined8 **)((long)in_RSI + 0x28));
    bVar1 = isAccessibleFrom(in_stack_ffffffffffffff18,
                             (Symbol *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
                            );
    if (bVar1) {
      return true;
    }
  }
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x129a873);
  pVar3 = getContainingClass(in_stack_ffffffffffffff30);
  code = SUB84((ulong)in_stack_ffffffffffffff30 >> 0x20,0);
  local_38 = pVar3.first;
  local_30 = pVar3.second;
  local_28 = local_38;
  local_20 = local_30;
  local_40 = std::get<0ul,slang::ast::ClassType_const*,bool>
                       ((pair<const_slang::ast::ClassType_*,_bool> *)0x129a8b5);
  local_48 = std::get<1ul,slang::ast::ClassType_const*,bool>
                       ((pair<const_slang::ast::ClassType_*,_bool> *)0x129a8ca);
  if ((*local_40 != (type)0x0) &&
     (bVar1 = isAccessibleFrom(in_stack_ffffffffffffff18,
                               (Symbol *)
                               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)),
     !bVar1)) {
    pSVar4 = local_10;
    not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x129a91e)
    ;
    code = SUB84((ulong)pSVar4 >> 0x20,0);
    bVar1 = anon_unknown_39::withinCovergroup(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (!bVar1) {
      bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x129a93d);
      if (bVar1) {
        local_54 = 0x1a000a;
        pSVar2 = std::optional<slang::SourceRange>::operator*
                           ((optional<slang::SourceRange> *)0x129a96a);
        local_68 = pSVar2->startLoc;
        local_60 = pSVar2->endLoc;
        sourceRange_00.startLoc._7_1_ = in_stack_ffffffffffffff27;
        sourceRange_00.startLoc._0_7_ = in_stack_ffffffffffffff20;
        sourceRange_00.endLoc = local_18;
        local_50 = ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff18,code,sourceRange_00);
        local_78 = (local_10->name)._M_len;
        local_70 = (local_10->name)._M_str;
        arg._M_str = in_stack_ffffffffffffff50;
        arg._M_len = in_stack_ffffffffffffff48;
        Diagnostic::operator<<(this,arg);
        local_88 = ((*local_40)->super_Type).super_Symbol.name._M_len;
        local_80 = ((*local_40)->super_Type).super_Symbol.name._M_str;
        arg_00._M_str = in_stack_ffffffffffffff50;
        arg_00._M_len = in_stack_ffffffffffffff48;
        Diagnostic::operator<<(this,arg_00);
      }
      return false;
    }
  }
  bVar5 = 1;
  if ((*local_48 & 1U) == 0) {
    in_stack_ffffffffffffff18 = (Symbol *)((long)local_18 + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_90,StaticInitializer);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)
                       CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                       (bitmask<slang::ast::ASTFlags> *)in_stack_ffffffffffffff08);
    bVar5 = 1;
    if ((!bVar1) && (bVar5 = 0, *local_40 == (type)0x0)) {
      pSVar4 = local_10;
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x129aab0);
      bVar1 = anon_unknown_39::withinCovergroup(pSVar4,in_stack_ffffffffffffff00);
      bVar5 = bVar1 ^ 0xff;
    }
  }
  if ((bVar5 & 1) == 0) {
    local_1 = true;
  }
  else {
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x129aae2);
    if (bVar1) {
      std::optional<slang::SourceRange>::operator*((optional<slang::SourceRange> *)0x129ab09);
      sourceRange_01.startLoc._7_1_ = bVar5;
      sourceRange_01.startLoc._0_7_ = in_stack_ffffffffffffff20;
      sourceRange_01.endLoc = in_stack_ffffffffffffff28;
      ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff18,code,sourceRange_01);
      Diagnostic::operator<<(this,local_10->name);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Lookup::ensureAccessible(const Symbol& symbol, const ASTContext& context,
                              std::optional<SourceRange> sourceRange) {
    if (context.randomizeDetails && context.randomizeDetails->classType &&
        Lookup::isAccessibleFrom(symbol, context.randomizeDetails->classType->asSymbol())) {
        return true;
    }

    auto [parent, inStatic] = getContainingClass(*context.scope);
    if (parent && !isAccessibleFrom(symbol, *parent) && !withinCovergroup(symbol, *context.scope)) {
        if (sourceRange) {
            auto& diag = context.addDiag(diag::NestedNonStaticClassProperty, *sourceRange);
            diag << symbol.name << parent->name;
        }
        return false;
    }
    else if (inStatic || context.flags.has(ASTFlags::StaticInitializer) ||
             (!parent && !withinCovergroup(symbol, *context.scope))) {
        if (sourceRange)
            context.addDiag(diag::NonStaticClassProperty, *sourceRange) << symbol.name;
        return false;
    }
    return true;
}